

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *window;
  ImVec2 window_00;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImU32 IVar16;
  ImDrawList *pIVar17;
  ImGuiWindow *pIVar18;
  char cVar19;
  ImDrawList **ppIVar20;
  ImGuiContext *g;
  ulong uVar21;
  int n;
  long lVar22;
  ImVec2 IVar23;
  long lVar24;
  ImVec2 IVar25;
  float fVar26;
  ImGuiWindow *windows_to_render_top_most [2];
  undefined1 local_58 [12];
  float fStack_4c;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar14 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  iVar2 = pIVar14->FrameCount;
  iVar3 = pIVar14->FrameCountRendered;
  pIVar14->FrameCountRendered = iVar2;
  (pIVar14->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar14->Hooks).Size) {
    lVar22 = 0;
    lVar24 = 0;
    do {
      pIVar4 = (pIVar14->Hooks).Data;
      if (*(int *)(pIVar4 + lVar22 + 4) == 4) {
        (**(code **)(pIVar4 + lVar22 + 0x10))(pIVar14);
      }
      lVar24 = lVar24 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar24 < (pIVar14->Hooks).Size);
  }
  if ((pIVar14->Viewports).Size != 0) {
    uVar21 = 0;
    do {
      pIVar5 = (pIVar14->Viewports).Data[uVar21];
      ImDrawDataBuilder::Clear(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar17 = GetViewportDrawList(pIVar5,0,"##Background");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar17);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)(pIVar14->Viewports).Size);
  }
  pIVar15 = GImGui;
  if (iVar3 != iVar2) {
    pIVar18 = GetTopMostAndVisiblePopupModal();
    fVar26 = pIVar15->DimBgRatio;
    if ((0.0 < fVar26) || (0.0 < pIVar15->NavWindowingHighlightAlpha)) {
      window = pIVar15->NavWindowingTargetAnim;
      if (window == (ImGuiWindow *)0x0) {
        cVar19 = '\0';
      }
      else {
        cVar19 = window->Active;
      }
      if ((pIVar18 != (ImGuiWindow *)0x0) || (cVar19 != '\0')) {
        if (pIVar18 == (ImGuiWindow *)0x0) {
          if (cVar19 != '\0') {
            local_58._0_8_ = *(ImVec2 *)((pIVar15->Style).Colors + 0x33);
            uVar10 = (pIVar15->Style).Colors[0x33].z;
            uVar11 = (pIVar15->Style).Colors[0x33].w;
            fStack_4c = fVar26 * (pIVar15->Style).Alpha * (float)uVar11;
            local_58._8_4_ = uVar10;
            IVar16 = ColorConvertFloat4ToU32((ImVec4 *)local_58);
            RenderDimmedBackgroundBehindWindow(window,IVar16);
            pIVar18 = pIVar15->NavWindowingTargetAnim;
            pIVar5 = *(GImGui->Viewports).Data;
            fVar26 = pIVar15->FontSize;
            fVar6 = (pIVar18->Pos).x;
            fVar7 = (pIVar18->Pos).y;
            local_48.x = fVar6 - fVar26;
            local_48.y = fVar7 - fVar26;
            aIStack_40[0].x = fVar26 + (pIVar18->Size).x + fVar6;
            aIStack_40[0].y = fVar26 + (pIVar18->Size).y + fVar7;
            if (((pIVar5->super_ImGuiViewport).Size.x <= aIStack_40[0].x - local_48.x) &&
               ((pIVar5->super_ImGuiViewport).Size.y <= aIStack_40[0].y - local_48.y)) {
              fVar26 = -1.0 - fVar26;
              local_48.x = local_48.x - fVar26;
              local_48.y = local_48.y - fVar26;
              aIStack_40[0].x = fVar26 + aIStack_40[0].x;
              aIStack_40[0].y = fVar26 + aIStack_40[0].y;
            }
            if ((pIVar18->DrawList->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar18->DrawList);
            }
            IVar23 = (pIVar5->super_ImGuiViewport).Pos;
            IVar25 = (pIVar5->super_ImGuiViewport).Size;
            local_58._4_4_ = IVar25.y + IVar23.y;
            local_58._0_4_ = IVar25.x + IVar23.x;
            ImDrawList::PushClipRect
                      (pIVar18->DrawList,&(pIVar5->super_ImGuiViewport).Pos,(ImVec2 *)local_58,false
                      );
            pIVar17 = pIVar18->DrawList;
            local_58._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x32);
            uVar12 = (GImGui->Style).Colors[0x32].z;
            uVar13 = (GImGui->Style).Colors[0x32].w;
            fStack_4c = pIVar15->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar13;
            local_58._8_4_ = uVar12;
            IVar16 = ColorConvertFloat4ToU32((ImVec4 *)local_58);
            ImDrawList::AddRect(pIVar17,&local_48,aIStack_40,IVar16,pIVar18->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar18->DrawList);
          }
        }
        else {
          pIVar18 = FindBottomMostVisibleWindowWithinBeginStack(pIVar18);
          local_58._0_8_ = *(ImVec2 *)((pIVar15->Style).Colors + 0x34);
          uVar8 = (pIVar15->Style).Colors[0x34].z;
          uVar9 = (pIVar15->Style).Colors[0x34].w;
          fStack_4c = fVar26 * (pIVar15->Style).Alpha * (float)uVar9;
          local_58._8_4_ = uVar8;
          IVar16 = ColorConvertFloat4ToU32((ImVec4 *)local_58);
          RenderDimmedBackgroundBehindWindow(pIVar18,IVar16);
        }
      }
    }
  }
  pIVar18 = pIVar14->NavWindowingTarget;
  if ((pIVar18 == (ImGuiWindow *)0x0) || ((pIVar18->Flags & 0x2000) != 0)) {
    IVar23.x = 0.0;
    IVar23.y = 0.0;
  }
  else {
    IVar23 = (ImVec2)pIVar18->RootWindow;
  }
  local_58._0_4_ = IVar23.x;
  local_58._4_4_ = IVar23.y;
  if (pIVar18 == (ImGuiWindow *)0x0) {
    IVar25.x = 0.0;
    IVar25.y = 0.0;
  }
  else {
    IVar25 = (ImVec2)pIVar14->NavWindowingListWindow;
  }
  stack0xffffffffffffffb0 = IVar25;
  if ((pIVar14->Windows).Size != 0) {
    uVar21 = 0;
    do {
      window_00 = *(ImVec2 *)((pIVar14->Windows).Data + uVar21);
      if (((*(bool *)((long)window_00 + 0x96) == true) &&
          (*(bool *)((long)window_00 + 0x9d) == false)) &&
         ((window_00 != IVar25 && window_00 != IVar23) &&
          (*(ImGuiWindowFlags *)((long)window_00 + 0xc) & 0x1000000U) == 0)) {
        AddWindowToDrawData((ImGuiWindow *)window_00,
                            (uint)*(ImGuiWindowFlags *)((long)window_00 + 0xc) >> 0x19 & 1);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)(pIVar14->Windows).Size);
  }
  lVar22 = 0;
  do {
    pIVar18 = *(ImGuiWindow **)(local_58 + lVar22 * 8);
    if (((pIVar18 != (ImGuiWindow *)0x0) && (pIVar18->Active == true)) && (pIVar18->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar18,(uint)pIVar18->Flags >> 0x19 & 1);
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 == 1);
  if ((((pIVar14->IO).MouseDrawCursor & iVar3 != iVar2) != 0) && (pIVar14->MouseCursor != -1)) {
    RenderMouseCursor((pIVar14->IO).MousePos,(pIVar14->Style).MouseCursorScale,pIVar14->MouseCursor,
                      0xffffffff,0xff000000,0x30000000);
  }
  (pIVar14->IO).MetricsRenderVertices = 0;
  (pIVar14->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar14->Viewports).Size) {
    lVar22 = 0;
    do {
      pIVar5 = (pIVar14->Viewports).Data[lVar22];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar17 = GetViewportDrawList(pIVar5,1,"##Foreground");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar17);
      }
      pIVar15 = GImGui;
      (pIVar5->DrawDataP).Valid = true;
      iVar2 = (pIVar5->DrawDataBuilder).Layers[0].Size;
      if (iVar2 < 1) {
        ppIVar20 = (ImDrawList **)0x0;
      }
      else {
        ppIVar20 = (pIVar5->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar5->DrawDataP).CmdLists = ppIVar20;
      (pIVar5->DrawDataP).CmdListsCount = iVar2;
      (pIVar5->DrawDataP).TotalIdxCount = 0;
      (pIVar5->DrawDataP).TotalVtxCount = 0;
      IVar23 = (pIVar5->super_ImGuiViewport).Size;
      (pIVar5->DrawDataP).DisplayPos = (pIVar5->super_ImGuiViewport).Pos;
      (pIVar5->DrawDataP).DisplaySize = IVar23;
      (pIVar5->DrawDataP).FramebufferScale = (pIVar15->IO).DisplayFramebufferScale;
      if (0 < iVar2) {
        lVar24 = 0;
        do {
          pIVar17 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar24];
          ImDrawList::_PopUnusedDrawCmd(pIVar17);
          piVar1 = &(pIVar5->DrawDataP).TotalVtxCount;
          *piVar1 = *piVar1 + (pIVar17->VtxBuffer).Size;
          piVar1 = &(pIVar5->DrawDataP).TotalIdxCount;
          *piVar1 = *piVar1 + (pIVar17->IdxBuffer).Size;
          lVar24 = lVar24 + 1;
        } while (lVar24 < (pIVar5->DrawDataBuilder).Layers[0].Size);
      }
      piVar1 = &(pIVar14->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + (pIVar5->DrawDataP).TotalVtxCount;
      piVar1 = &(pIVar14->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + (pIVar5->DrawDataP).TotalIdxCount;
      lVar22 = lVar22 + 1;
    } while (lVar22 < (pIVar14->Viewports).Size);
  }
  if (0 < (pIVar14->Hooks).Size) {
    lVar22 = 0;
    lVar24 = 0;
    do {
      pIVar4 = (pIVar14->Hooks).Data;
      if (*(int *)(pIVar4 + lVar22 + 4) == 5) {
        (**(code **)(pIVar4 + lVar22 + 0x10))(pIVar14,pIVar4 + lVar22);
      }
      lVar24 = lVar24 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar24 < (pIVar14->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}